

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

Clause * __thiscall LinearGE<1,_1>::explain(LinearGE<1,_1> *this,Lit param_2,int inf_id)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Lit LVar4;
  Lit *pLVar5;
  Lit *pLVar6;
  Clause *pCVar7;
  int in_EDX;
  long in_RDI;
  uint i_1;
  uint i;
  BoolView *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  uint local_24;
  uint local_1c;
  int local_14;
  
  uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28));
  uVar3 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 0x38));
  local_14 = in_EDX;
  if (in_EDX == uVar2 + uVar3) {
    local_14 = -1;
  }
  bVar1 = BoolView::isFixed((BoolView *)0x268de4);
  if (bVar1) {
    LVar4 = BoolView::getValLit(in_stack_ffffffffffffffa8);
    pLVar5 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),0);
    pLVar5->x = LVar4.x;
  }
  for (local_1c = 0; uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28)),
      local_1c < uVar2; local_1c = local_1c + 1) {
    vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_1c);
    LVar4 = IntView<2>::getMaxLit((IntView<2> *)in_stack_ffffffffffffffa8);
    pLVar5 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_1c + 1);
    pLVar5->x = LVar4.x;
  }
  for (local_24 = 0; uVar2 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 0x38)),
      local_24 < uVar2; local_24 = local_24 + 1) {
    vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_24);
    LVar4 = IntView<3>::getMaxLit((IntView<3> *)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb4 = local_24 + 1;
    uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28));
    pLVar5 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),in_stack_ffffffffffffffb4 + uVar2);
    pLVar5->x = LVar4.x;
  }
  pLVar5 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),0);
  pLVar6 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_14 + 1);
  pLVar6->x = pLVar5->x;
  pCVar7 = Reason_new<vec<Lit>>
                     ((vec<Lit> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return pCVar7;
}

Assistant:

Clause* explain(Lit /*p*/, int inf_id) override {
		if (inf_id == static_cast<int>(x.size() + y.size())) {
			inf_id = -1;
		}
		if ((R != 0) && r.isFixed()) {
			ps[0] = r.getValLit();
		}
		for (unsigned int i = 0; i < x.size(); i++) {
			ps[i + R] = x[i].getMaxLit();
		}
		for (unsigned int i = 0; i < y.size(); i++) {
			ps[i + R + x.size()] = y[i].getMaxLit();
		}
		ps[R + inf_id] = ps[0];
		return Reason_new(ps);
	}